

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGTextPositioningElement::SVGTextPositioningElement
          (SVGTextPositioningElement *this,Document *document,ElementID id)

{
  SVGGraphicsElement::SVGGraphicsElement(&this->super_SVGGraphicsElement,document,id);
  (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGTextPositioningElement_0015b118;
  SVGProperty::SVGProperty(&(this->m_x).super_SVGProperty,X);
  (this->m_x).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGLengthList_0015ae70;
  *(undefined2 *)&(this->m_x).super_SVGProperty.field_0x9 = 0;
  (this->m_x).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_x).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_x).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVGProperty::SVGProperty(&(this->m_y).super_SVGProperty,Y);
  (this->m_y).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGLengthList_0015ae70;
  *(undefined2 *)&(this->m_y).super_SVGProperty.field_0x9 = 1;
  (this->m_y).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_y).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_y).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVGProperty::SVGProperty(&(this->m_dx).super_SVGProperty,Dx);
  (this->m_dx).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGLengthList_0015ae70;
  *(undefined2 *)&(this->m_dx).super_SVGProperty.field_0x9 = 0;
  (this->m_dx).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dx).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dx).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVGProperty::SVGProperty(&(this->m_dy).super_SVGProperty,Dy);
  (this->m_dy).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGLengthList_0015ae70;
  *(undefined2 *)&(this->m_dy).super_SVGProperty.field_0x9 = 1;
  (this->m_dy).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dy).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dy).m_values.super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVGProperty::SVGProperty(&(this->m_rotate).super_SVGProperty,Rotate);
  (this->m_rotate).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGNumberList_0015af30;
  (this->m_rotate).m_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rotate).m_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_rotate).m_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVGProperty::SVGProperty(&(this->m_textLength).super_SVGProperty,TextLength);
  (this->m_textLength).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_textLength).super_SVGProperty.field_0x9 = 0x100;
  *(undefined4 *)&(this->m_textLength).super_SVGProperty.field_0xc = 0;
  (this->m_textLength).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_lengthAdjust).super_SVGProperty,LengthAdjust);
  (this->m_lengthAdjust).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015b340;
  (this->m_lengthAdjust).super_SVGProperty.field_0x9 = 0;
  (this->m_font).m_face.m_face = (plutovg_font_face_t *)0x0;
  (this->m_font).m_size = 0.0;
  (this->m_fill).m_element = (SVGPaintElement *)0x0;
  (this->m_fill).m_color.m_value = 0;
  (this->m_fill).m_opacity = 0.0;
  (this->m_stroke).m_element = (SVGPaintElement *)0x0;
  (this->m_stroke).m_color.m_value = 0;
  *(undefined8 *)&(this->m_stroke).m_opacity = 0x3f80000000000000;
  this->m_baseline_offset = 0.0;
  this->m_alignment_baseline = Auto;
  this->m_dominant_baseline = Auto;
  this->m_text_anchor = Start;
  this->m_white_space = Default;
  this->m_direction = Ltr;
  SVGElement::addProperty((SVGElement *)this,&(this->m_x).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_dx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_dy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_rotate).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_textLength).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_lengthAdjust).super_SVGProperty);
  return;
}

Assistant:

SVGTextPositioningElement::SVGTextPositioningElement(Document* document, ElementID id)
    : SVGGraphicsElement(document, id)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_dx(PropertyID::Dx, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_dy(PropertyID::Dy, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_rotate(PropertyID::Rotate)
    , m_textLength(PropertyID::TextLength, LengthDirection::Horizontal, LengthNegativeMode::Forbid)
    , m_lengthAdjust(PropertyID::LengthAdjust, LengthAdjust::Spacing)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_dx);
    addProperty(m_dy);
    addProperty(m_rotate);
    addProperty(m_textLength);
    addProperty(m_lengthAdjust);
}